

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O1

Term * Inferences::InductionHelper::getOtherTermFromComparison(Literal *l,Term *t)

{
  bool bVar1;
  bool bVar2;
  TermList TVar3;
  uint n;
  
  bVar2 = anon_unknown_1::isIntegerComparisonLiteral(l);
  if (bVar2) {
    bVar2 = false;
    TVar3 = Kernel::Term::termArg(&l->super_Term,0);
    if ((Term *)TVar3._content == t) {
      n = 1;
    }
    else {
      bVar1 = false;
      do {
        bVar2 = bVar1;
        if (bVar2) goto LAB_004fb2f2;
        TVar3 = Kernel::Term::termArg(&l->super_Term,1);
        bVar1 = true;
      } while ((Term *)TVar3._content != t);
      n = 0;
    }
    TVar3 = Kernel::Term::termArg(&l->super_Term,n);
LAB_004fb2f2:
    if (!bVar2) {
      return (Term *)TVar3._content;
    }
  }
  return (Term *)0x0;
}

Assistant:

Term* InductionHelper::getOtherTermFromComparison(Literal* l, Term* t) {
  if (isIntegerComparisonLiteral(l)) {
    ASS(l->ground());
    ASS_EQ(l->arity(),2);
    for (unsigned i = 0; i < 2; ++i) {
      if (l->termArg(i).term() == t) {
        return l->termArg(1-i).term();
      }
    }
  }
  return nullptr;
}